

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * operator+=(QString *a,QStringBuilder<const_char_(&)[2],_ProString> *b)

{
  ArrayOptions *pAVar1;
  int iVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  QChar *__dest;
  CutResult CVar5;
  long lVar6;
  long lVar7;
  char16_t *__src;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QChar *it;
  QChar *local_48;
  long local_40;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (a->d).d;
  lVar6 = (a->d).size;
  iVar2 = (b->b).m_length;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar6);
  }
  lVar6 = lVar6 + iVar2 + 1;
  pDVar3 = (a->d).d;
  if (pDVar3 == (Data *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (pDVar3->super_QArrayData).alloc -
            (((long)((long)(a->d).ptr -
                    ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             1) + (a->d).size);
  }
  if (lVar7 < lVar6) {
    if (pDVar3 == (Data *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = (pDVar3->super_QArrayData).alloc * 2;
    }
    if (lVar7 < lVar6) {
      lVar7 = lVar6;
    }
    if (((pDVar3 == (Data *)0x0) ||
        (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar3->super_QArrayData).alloc -
        ((long)((long)(a->d).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)
        <= lVar7)) {
      lVar6 = (a->d).size;
      if (lVar7 < lVar6) {
        lVar7 = lVar6;
      }
      QString::reallocData((longlong)a,(AllocationOption)lVar7);
    }
    pDVar3 = (a->d).d;
    if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar3 = (a->d).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
  }
  local_48 = (QChar *)((a->d).ptr + (a->d).size);
  QVar8.m_data = *b->a;
  QVar8.m_size = 1;
  QAbstractConcatenable::convertFromUtf8(QVar8,&local_48);
  __dest = local_48;
  lVar6 = (long)(b->b).m_length;
  if (lVar6 != 0) {
    pcVar4 = (b->b).m_string.d.ptr;
    local_38 = (long)(b->b).m_offset;
    local_40 = lVar6;
    CVar5 = QtPrivate::QContainerImplHelper::mid((b->b).m_string.d.size,&local_38,&local_40);
    __src = (char16_t *)0x0;
    if (CVar5 != Null) {
      __src = pcVar4 + local_38;
    }
    memcpy(__dest,__src,lVar6 * 2);
    local_48 = local_48 + lVar6;
  }
  QString::resize((longlong)a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return a;
  }
  __stack_chk_fail();
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}